

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

int __thiscall
opengv::point_cloud::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  undefined8 uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  PointerType ptr;
  long lVar12;
  Indices *pIVar13;
  SrcEvaluatorType srcEvaluator;
  int iVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Matrix<double,_4,_1,_0,_4,_1> p_hom;
  transformation_t transformation;
  cayley_t cayley;
  double local_1c0;
  double dStack_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190 [12];
  undefined8 auStack_130 [2];
  undefined1 local_120 [16];
  double local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  double local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  double dStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  cayley_t local_70 [2];
  
  pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_d8 = *pdVar2;
  dStack_d0 = pdVar2[1];
  local_c8 = pdVar2[2];
  local_70[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = pdVar2[3];
  local_70[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = pdVar2[4];
  local_70[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = pdVar2[5];
  math::cayley2rot(local_70);
  lVar12 = 0x10;
  do {
    uVar6 = *(undefined8 *)((long)local_190 + lVar12 + 8);
    uVar1 = *(undefined8 *)((long)local_190 + lVar12 + 0x10);
    *(undefined8 *)((long)auStack_130 + lVar12) = *(undefined8 *)((long)local_190 + lVar12);
    *(undefined8 *)((long)auStack_130 + lVar12 + 8) = uVar6;
    *(undefined8 *)(local_120 + lVar12) = uVar1;
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x58);
  local_190[5] = 1.0;
  pIVar13 = this->_indices;
  if (pIVar13->_numberCorrespondences != 0) {
    lVar12 = 0;
    uVar15 = 0;
    local_a0 = local_108;
    uStack_98 = uStack_100;
    local_b0 = local_f0;
    uStack_a8 = uStack_e8;
    local_90 = local_120;
    local_c0 = local_d8;
    dStack_b8 = dStack_d0;
    local_190[0] = local_110;
    local_198 = local_f8;
    local_1a0 = local_e0;
    local_1a8 = local_c8;
    do {
      iVar14 = (int)uVar15;
      iVar11 = iVar14;
      if (pIVar13->_useIndices != false) {
        iVar11 = *(int *)((long)(pIVar13->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar12 >> 0x1e));
      }
      (*this->_adapter->_vptr_PointCloudAdapterBase[3])(&local_1c0,this->_adapter,(long)iVar11);
      auVar16._8_8_ = local_1c0;
      auVar16._0_8_ = local_1c0;
      auVar16 = vmulpd_avx512vl(local_90,auVar16);
      auVar10._8_8_ = uStack_98;
      auVar10._0_8_ = local_a0;
      local_190[2] = local_1c0;
      local_190[3] = dStack_1b8;
      local_190[4] = local_1b0;
      auVar3._8_8_ = dStack_1b8;
      auVar3._0_8_ = dStack_1b8;
      auVar16 = vfmadd231pd_avx512vl(auVar16,auVar10,auVar3);
      auVar9._8_8_ = uStack_a8;
      auVar9._0_8_ = local_b0;
      auVar4._8_8_ = local_1b0;
      auVar4._0_8_ = local_1b0;
      auVar16 = vfmadd231pd_avx512vl(auVar16,auVar9,auVar4);
      auVar8._8_8_ = dStack_b8;
      auVar8._0_8_ = local_c0;
      auVar5._8_8_ = local_190[5];
      auVar5._0_8_ = local_190[5];
      local_80 = vfmadd231pd_avx512vl(auVar16,auVar8,auVar5);
      if (this->_indices->_useIndices != false) {
        iVar14 = *(int *)((long)(this->_indices->_indices->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + (lVar12 >> 0x1e));
      }
      local_190[1] = local_1c0 * local_190[0] + local_198 * dStack_1b8 +
                     local_1b0 * local_1a0 + local_1a8;
      (*this->_adapter->_vptr_PointCloudAdapterBase[2])(&local_1c0,this->_adapter,(long)iVar14);
      auVar7._8_8_ = dStack_1b8;
      auVar7._0_8_ = local_1c0;
      auVar16 = vsubpd_avx(auVar7,local_80);
      lVar12 = lVar12 + 0x100000000;
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           (local_1b0 - local_190[1]) * (local_1b0 - local_190[1]) +
           auVar16._0_8_ * auVar16._0_8_ + auVar16._8_8_ * auVar16._8_8_;
      auVar16 = vsqrtsd_avx(auVar17,auVar17);
      (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [uVar15] = auVar16._0_8_;
      uVar15 = uVar15 + 1;
      pIVar13 = this->_indices;
    } while (uVar15 < pIVar13->_numberCorrespondences);
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    transformation_t transformation;
    transformation.col(3) = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    transformation.block<3,3>(0,0) = math::cayley2rot(cayley);

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for( size_t i = 0; i < _indices.size(); i++ )
    {
      p_hom.block<3,1>(0,0) = _adapter.getPoint2(_indices[i]);
      point_t transformedPoint = transformation * p_hom;
      translation_t error = _adapter.getPoint1(_indices[i]) - transformedPoint;
      fvec[i] = error.norm();
    }

    return 0;
  }